

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
AsyncRgbLedSimulationDataGenerator::Initialize
          (AsyncRgbLedSimulationDataGenerator *this,U32 simulation_sample_rate,
          AsyncRgbLedAnalyzerSettings *settings)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  ostream *this_00;
  double clockFrequencyUnused;
  AsyncRgbLedAnalyzerSettings *settings_local;
  U32 simulation_sample_rate_local;
  AsyncRgbLedSimulationDataGenerator *this_local;
  
  srand(0x2a);
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  bVar2 = AsyncRgbLedAnalyzerSettings::BitSize(this->mSettings);
  this->mMaximumChannelValue = (1 << (bVar2 & 0x1f)) - 1;
  iVar1 = (int)this;
  ClockGenerator::Init(1.0,iVar1 + 0x10);
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mLEDSimulationData);
  SimulationChannelDescriptor::SetSampleRate(iVar1 + 0x18);
  SimulationChannelDescriptor::SetInitialBitState(iVar1 + 0x18);
  bVar3 = AsyncRgbLedAnalyzerSettings::IsHighSpeedSupported(this->mSettings);
  if (bVar3) {
    if (this->mSimulationSampleRateHz < 0x112a881) {
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "Disabling high-speed data generation due to simulated sample rate")
      ;
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    else {
      this->mDoGenerateHighSpeedMode = true;
    }
  }
  return;
}

Assistant:

void AsyncRgbLedSimulationDataGenerator::Initialize( U32 simulation_sample_rate, AsyncRgbLedAnalyzerSettings* settings )
{
    // Initialize the random number generator with a literal seed to obtain repeatability
    // Change this for srand(time(NULL)) for "truly" random sequences
    // NOTICE rand() an srand() are *not* thread safe
    srand( 42 );

    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mMaximumChannelValue = ( 1 << mSettings->BitSize() ) - 1;

    // TODO pass in the analyzer and call GetMinimumSampleRate?
    const double clockFrequencyUnused = 1.0;
    mClockGenerator.Init( clockFrequencyUnused, mSimulationSampleRateHz );

    mLEDSimulationData.SetChannel( mSettings->mInputChannel );
    mLEDSimulationData.SetSampleRate( simulation_sample_rate );
    mLEDSimulationData.SetInitialBitState( BIT_LOW );

    if( mSettings->IsHighSpeedSupported() )
    {
        // check if the requested sample rate is high enough
        if( mSimulationSampleRateHz > 18000000 )
        {
            mDoGenerateHighSpeedMode = true;
        }
        else
        {
            std::cerr << "Disabling high-speed data generation due to simulated sample rate" << std::endl;
        }
    }
}